

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

ostream * Catch::operator<<(ostream *os,LazyExpression *lazyExpr)

{
  bool bVar1;
  ostream *poVar2;
  LazyExpression *in_RSI;
  ostream *in_RDI;
  ITransientExpression *in_stack_ffffffffffffffe8;
  
  if ((in_RSI->m_isNegated & 1U) != 0) {
    std::operator<<(in_RDI,"!");
  }
  bVar1 = LazyExpression::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    if (((in_RSI->m_isNegated & 1U) == 0) ||
       (bVar1 = ITransientExpression::isBinaryExpression(in_RSI->m_transientExpression), !bVar1)) {
      anon_unknown_1::operator<<((ostream *)in_RSI,in_stack_ffffffffffffffe8);
    }
    else {
      std::operator<<(in_RDI,"(");
      poVar2 = anon_unknown_1::operator<<((ostream *)in_RSI,in_stack_ffffffffffffffe8);
      std::operator<<((ostream *)poVar2,")");
    }
  }
  else {
    std::operator<<(in_RDI,"{** error - unchecked empty expression requested **}");
  }
  return (ostream *)in_RDI;
}

Assistant:

auto operator << ( std::ostream& os, LazyExpression const& lazyExpr ) -> std::ostream& {
        if( lazyExpr.m_isNegated )
            os << "!";

        if( lazyExpr ) {
            if( lazyExpr.m_isNegated && lazyExpr.m_transientExpression->isBinaryExpression() )
                os << "(" << *lazyExpr.m_transientExpression << ")";
            else
                os << *lazyExpr.m_transientExpression;
        }
        else {
            os << "{** error - unchecked empty expression requested **}";
        }
        return os;
    }